

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_util.cpp
# Opt level: O2

string * __thiscall
cfd::core::StringUtil::ByteToString_abi_cxx11_
          (string *__return_storage_ptr__,StringUtil *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *bytes)

{
  long lVar1;
  CfdException *this_00;
  char *wally_string;
  allocator local_4d;
  int ret;
  char *buffer;
  undefined1 local_40 [32];
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  lVar1 = *(long *)this;
  if (lVar1 == *(long *)(this + 8)) {
    local_40._0_8_ = "cfdcore_util.cpp";
    local_40._8_4_ = 0x4e1;
    local_40._16_8_ = "ByteToString";
    logger::info<>((CfdSourceLocation *)local_40,"bytes empty. return empty string.");
  }
  else {
    buffer = (char *)0x0;
    ret = wally_hex_from_bytes(lVar1,*(long *)(this + 8) - lVar1);
    if (ret != 0) {
      local_40._0_8_ = "cfdcore_util.cpp";
      local_40._8_4_ = 0x4e8;
      local_40._16_8_ = "ByteToString";
      logger::warn<int&>((CfdSourceLocation *)local_40,"wally_hex_from_bytes NG[{}].",&ret);
      this_00 = (CfdException *)__cxa_allocate_exception(0x30);
      ::std::__cxx11::string::string((string *)local_40,"byte to hex convert error.",&local_4d);
      CfdException::CfdException(this_00,kCfdIllegalArgumentError,(string *)local_40);
      __cxa_throw(this_00,&CfdException::typeinfo,CfdException::~CfdException);
    }
    WallyUtil::ConvertStringAndFree_abi_cxx11_((string *)local_40,(WallyUtil *)buffer,wally_string);
    ::std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)local_40);
    ::std::__cxx11::string::~string((string *)local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string StringUtil::ByteToString(const std::vector<uint8_t> &bytes) {
  std::string byte_str;
  if (bytes.empty()) {
    info(CFD_LOG_SOURCE, "bytes empty. return empty string.");
  } else {
    char *buffer = NULL;
    int ret = wally_hex_from_bytes(bytes.data(), bytes.size(), &buffer);
    if (ret == WALLY_OK) {
      byte_str = WallyUtil::ConvertStringAndFree(buffer);
    } else {
      warn(CFD_LOG_SOURCE, "wally_hex_from_bytes NG[{}].", ret);
      throw CfdException(
          kCfdIllegalArgumentError, "byte to hex convert error.");
    }
  }
  return byte_str;
}